

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int pager_write_dirty_pages(Pager *pPager,Page *pDirty)

{
  Page *pPVar1;
  int iVar2;
  
  iVar2 = 0;
  if (pDirty != (Page *)0x0) {
    do {
      pPVar1 = pDirty->pDirtyPrev;
      if (((pDirty->flags & 8) == 0) &&
         (iVar2 = (*pPager->pfd->pMethods->xWrite)
                            (pPager->pfd,pDirty->zData,(long)pPager->iPageSize,
                             pDirty->pgno * (long)pPager->iPageSize), iVar2 != 0)) break;
      *(byte *)&pDirty->flags = (byte)pDirty->flags & 0x91;
      if (pDirty->nRef < 1) {
        pager_unlink_page(pPager,pDirty);
        pager_release_page(pPager,pDirty);
      }
      pDirty = pPVar1;
      iVar2 = 0;
    } while (pPVar1 != (Page *)0x0);
  }
  pPager->pFirstDirty = (Page *)0x0;
  pPager->pDirty = (Page *)0x0;
  pPager->pHotDirty = (Page *)0x0;
  pPager->pFirstHot = (Page *)0x0;
  pPager->nHot = 0;
  return iVar2;
}

Assistant:

static int pager_write_dirty_pages(Pager *pPager,Page *pDirty)
{
	int rc = UNQLITE_OK;
	Page *pNext;
	for(;;){
		if( pDirty == 0 ){
			break;
		}
		/* Point to the next dirty page */
		pNext = pDirty->pDirtyPrev; /* Not a bug: Reverse link */
		if( (pDirty->flags & PAGE_DONT_WRITE) == 0 ){
			rc = unqliteOsWrite(pPager->pfd,pDirty->zData,pPager->iPageSize,pDirty->pgno * pPager->iPageSize);
			if( rc != UNQLITE_OK ){
				/* A rollback should be done */
				break;
			}
		}
		/* Remove stale flags */
		pDirty->flags &= ~(PAGE_DIRTY|PAGE_DONT_WRITE|PAGE_NEED_SYNC|PAGE_IN_JOURNAL|PAGE_HOT_DIRTY);
		if( pDirty->nRef < 1 ){
			/* Unlink the page now it is unused */
			pager_unlink_page(pPager,pDirty);
			/* Release the page */
			pager_release_page(pPager,pDirty);
		}
		/* Point to the next page */
		pDirty = pNext;
	}
	pPager->pDirty = pPager->pFirstDirty = 0;
	pPager->pHotDirty = pPager->pFirstHot = 0;
	pPager->nHot = 0;
	return rc;
}